

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

void Js::HandleHelperOrLibraryMethodWrapperException<true>
               (ScriptContext *scriptContext,JavascriptExceptionObject *exceptionObject)

{
  code *pcVar1;
  JavascriptExceptionObject *pJVar2;
  int iVar3;
  bool bVar4;
  uint32 uVar5;
  uint functionNumber;
  undefined4 *puVar6;
  ThreadContext *pTVar7;
  JavascriptExceptionObject *pJVar8;
  JavascriptExceptionObject *pJVar9;
  DebugContext *this;
  ProbeContainer *this_00;
  DebugManager *this_01;
  DebuggingFlags *this_02;
  FunctionBody *pFVar10;
  undefined1 local_40 [8];
  ByteCodeReader reader;
  int local_20;
  int offsetFromDebugger;
  int nextStatementOffset;
  bool isTopUserFrameJavaScript;
  bool isTopUserFrameNative;
  JavascriptExceptionObject *exceptionObject_local;
  ScriptContext *scriptContext_local;
  
  _nextStatementOffset = exceptionObject;
  exceptionObject_local = (JavascriptExceptionObject *)scriptContext;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd3,"(scriptContext)","scriptContext");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (_nextStatementOffset == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd4,"(exceptionObject)","exceptionObject");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar4 = JavascriptExceptionObject::IsDebuggerSkip(_nextStatementOffset);
  pJVar9 = _nextStatementOffset;
  if (bVar4) {
    pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)exceptionObject_local);
    pJVar8 = ThreadContext::GetPendingOOMErrorObject(pTVar7);
    pJVar2 = _nextStatementOffset;
    if (pJVar9 != pJVar8) {
      pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)exceptionObject_local);
      pJVar9 = ThreadContext::GetPendingSOErrorObject(pTVar7);
      if (pJVar2 != pJVar9) {
        offsetFromDebugger._2_1_ =
             JavascriptStackWalker::TryIsTopJavaScriptFrameNative
                       ((ScriptContext *)exceptionObject_local,
                        (bool *)((long)&offsetFromDebugger + 3),true);
        if (!(bool)offsetFromDebugger._2_1_) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                      ,0xe6,"(isTopUserFrameJavaScript)",
                                      "How could we get non-javascript frame on exception?");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (((offsetFromDebugger._2_1_ & 1) != 0) && ((offsetFromDebugger._3_1_ & 1) == 0)) {
          JavascriptExceptionOperators::DoThrowCheckClone
                    (_nextStatementOffset,(ScriptContext *)exceptionObject_local);
        }
        bVar4 = JavascriptExceptionObject::IsDebuggerSkip(_nextStatementOffset);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                      ,0xf0,"(exceptionObject->IsDebuggerSkip())",
                                      "exceptionObject->IsDebuggerSkip()");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        reader.m_endLocation._4_4_ =
             JavascriptExceptionObject::GetByteCodeOffsetAfterDebuggerSkip(_nextStatementOffset);
        iVar3 = reader.m_endLocation._4_4_;
        if (reader.m_endLocation._4_4_ == -1) {
          pFVar10 = JavascriptExceptionObject::GetFunctionBody(_nextStatementOffset);
          uVar5 = JavascriptExceptionObject::GetByteCodeOffset(_nextStatementOffset);
          ByteCodeReader::Create((ByteCodeReader *)local_40,pFVar10,uVar5);
          this = ScriptContext::GetDebugContext((ScriptContext *)exceptionObject_local);
          this_00 = DebugContext::GetProbeContainer(this);
          pFVar10 = JavascriptExceptionObject::GetFunctionBody(_nextStatementOffset);
          uVar5 = JavascriptExceptionObject::GetByteCodeOffset(_nextStatementOffset);
          bVar4 = ProbeContainer::GetNextUserStatementOffsetForAdvance
                            (this_00,pFVar10,(ByteCodeReader *)local_40,uVar5,&local_20);
          iVar3 = local_20;
          if (!bVar4) {
            JavascriptExceptionOperators::DoThrowCheckClone
                      (_nextStatementOffset,(ScriptContext *)exceptionObject_local);
          }
        }
        local_20 = iVar3;
        pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)exceptionObject_local);
        this_01 = ThreadContext::GetDebugManager(pTVar7);
        this_02 = DebugManager::GetDebuggingFlags(this_01);
        iVar3 = local_20;
        pFVar10 = JavascriptExceptionObject::GetFunctionBody(_nextStatementOffset);
        functionNumber = FunctionProxy::GetFunctionNumber((FunctionProxy *)pFVar10);
        DebuggingFlags::SetByteCodeOffsetAndFuncAfterIgnoreException(this_02,iVar3,functionNumber);
        return;
      }
    }
  }
  JavascriptExceptionOperators::DoThrowCheckClone
            (_nextStatementOffset,(ScriptContext *)exceptionObject_local);
}

Assistant:

void HandleHelperOrLibraryMethodWrapperException(ScriptContext * scriptContext, JavascriptExceptionObject * exceptionObject)
    {
        Assert(scriptContext);
        Assert(exceptionObject);

        // Note: there also could be plain OutOfMemoryException and StackOverflowException, no special handling for these.
        if (!exceptionObject->IsDebuggerSkip() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingOOMErrorObject() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
        }

        if (doCheckParentInterpreterFrame)
        {
            // Note: JavascriptStackWalker is slow, but this is not hot path at all.
            // Note: we treat internal script code (such as Intl) as library code, thus
            //       ignore isLibraryCode=true callers.
            bool isTopUserFrameNative;
            bool isTopUserFrameJavaScript = Js::JavascriptStackWalker::TryIsTopJavaScriptFrameNative(
                scriptContext, &isTopUserFrameNative, /* ignoreLibraryCode = */ true);
            AssertMsg(isTopUserFrameJavaScript, "How could we get non-javascript frame on exception?");

            if (isTopUserFrameJavaScript && !isTopUserFrameNative)
            {
                // If parent frame is interpreter frame, it already has try-catch around all calls,
                // so that we don't need any special handling here.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        Assert(exceptionObject->IsDebuggerSkip());
        int nextStatementOffset;
        int offsetFromDebugger = exceptionObject->GetByteCodeOffsetAfterDebuggerSkip();
        if (offsetFromDebugger != DebuggingFlags::InvalidByteCodeOffset)
        {
            // The offset is already set for us by debugger (such as by set next statement).
            nextStatementOffset = offsetFromDebugger;
        }
        else
        {
            ByteCodeReader reader;
            reader.Create(exceptionObject->GetFunctionBody(), exceptionObject->GetByteCodeOffset());
            // Determine offset for next statement here.
            if (!scriptContext->GetDebugContext()->GetProbeContainer()->GetNextUserStatementOffsetForAdvance(
                exceptionObject->GetFunctionBody(), &reader, exceptionObject->GetByteCodeOffset(), &nextStatementOffset))
            {
                // Can't advance.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        // Continue after exception.
        // Note: for this scenario InterpreterStackFrame::DebugProcess resets its state,
        // looks like we don't need to that because we start with brand new interpreter frame.

        // Indicate to bailout check that we should bail out for/into debugger and set the byte code offset to one of next statement.
        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetByteCodeOffsetAndFuncAfterIgnoreException(
            nextStatementOffset, exceptionObject->GetFunctionBody()->GetFunctionNumber());
    }